

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O3

CFavoriteServer * __thiscall
CServerBrowserFavorites::FindFavoriteByHostname
          (CServerBrowserFavorites *this,char *pHostname,int *Index)

{
  int iVar1;
  CServerBrowserFavorites *b;
  long lVar2;
  
  if (0 < this->m_NumFavoriteServers) {
    lVar2 = 0;
    b = this;
    do {
      iVar1 = str_comp(pHostname,(char *)b);
      if (iVar1 == 0) {
        if (Index == (int *)0x0) {
          return b->m_aFavoriteServers;
        }
        *Index = (int)lVar2;
        return b->m_aFavoriteServers;
      }
      lVar2 = lVar2 + 1;
      b = (CServerBrowserFavorites *)(b->m_aFavoriteServers + 1);
    } while (lVar2 < this->m_NumFavoriteServers);
  }
  return (CFavoriteServer *)0x0;
}

Assistant:

CServerBrowserFavorites::CFavoriteServer *CServerBrowserFavorites::FindFavoriteByHostname(const char *pHostname, int *Index)
{
	for(int i = 0; i < m_NumFavoriteServers; i++)
	{
		if(str_comp(pHostname, m_aFavoriteServers[i].m_aHostname) == 0)
		{
			if(Index)
				*Index = i;
			return &m_aFavoriteServers[i];
		}
	}

	return 0;
}